

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O1

void cluster_points_recalculate(int n,int n_cluster,vec3f *positions,int *clusterids)

{
  vector<int,std::allocator<int>> *this;
  iterator __position;
  int *piVar1;
  void *pvVar2;
  undefined4 uVar3;
  undefined1 auVar4 [8];
  uint uVar5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  undefined1 *__s;
  ulong uVar13;
  undefined1 *puVar14;
  uint uVar15;
  long lVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uStack_280;
  undefined1 local_278 [8];
  ofstream fout;
  char local_268 [232];
  ios_base local_180 [264];
  undefined1 *local_78;
  float *local_70;
  long local_68;
  undefined1 *local_60;
  int *local_58;
  long local_50;
  ulong local_48;
  uint local_3c;
  int local_38;
  uint local_34;
  
  uStack_280 = 0x15a738;
  local_278 = (undefined1  [8])local_268;
  local_34 = n_cluster;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"receiver cluster","");
  uStack_280 = 0x15a74b;
  github111116::ConsoleLogger::time(&console,(time_t *)local_278);
  local_58 = clusterids;
  if (local_278 != (undefined1  [8])local_268) {
    uStack_280 = 0x15a760;
    operator_delete((void *)local_278);
  }
  uVar11 = (ulong)local_34;
  lVar7 = -(uVar11 * 0xc + 0xf & 0xfffffffffffffff0);
  puVar14 = local_278 + lVar7;
  local_3c = n;
  if (local_34 != 0) {
    *(undefined8 *)((long)&uStack_280 + lVar7) = 0x15a7bd;
    memset(puVar14,0,((uVar11 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  uVar15 = local_3c;
  local_50 = uVar11 * 3;
  if (0 < (int)local_34) {
    local_48 = uVar11 * 0xc;
    lVar16 = 0;
    do {
      *(undefined8 *)((long)&uStack_280 + lVar7) = 0x15a7e3;
      iVar6 = rand();
      *(undefined8 *)(puVar14 + lVar16) = *(undefined8 *)(positions + iVar6 % (int)uVar15);
      *(data_t *)(&fout + lVar16 + lVar7) = positions[iVar6 % (int)uVar15].z;
      lVar16 = lVar16 + 0xc;
    } while (local_48 != lVar16);
  }
  __s = puVar14 + -(local_50 * 8 + 0xfU & 0xfffffffffffffff0);
  local_60 = puVar14;
  if (local_34 != 0) {
    lVar7 = local_50 * 8;
    *(undefined8 *)(__s + -8) = 0x15a85c;
    memset(__s,0,((lVar7 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffff00000000);
  local_68 = uVar11 * 8;
  lVar7 = uVar11 * 0x18;
  local_70 = (float *)(local_60 + 8);
  puVar14 = __s;
  uVar15 = local_3c;
  local_78 = __s;
  local_50 = lVar7;
  do {
    *(undefined8 *)(__s + -8) = 0x15a8ab;
    github111116::ConsoleLogger::log<char[27],int>
              (&console,(char (*) [27])"receiver cluster iteration",(int *)local_278);
    if (0 < (int)local_34) {
      lVar16 = 0;
      do {
        if (*(long *)(puVar14 + lVar16 + 8) != *(long *)(puVar14 + lVar16)) {
          *(long *)(puVar14 + lVar16 + 8) = *(long *)(puVar14 + lVar16);
        }
        lVar16 = lVar16 + 0x18;
      } while (lVar7 != lVar16);
    }
    local_38 = 0;
    if (0 < (int)uVar15) {
      do {
        if ((int)local_34 < 1) {
          lVar16 = 0;
        }
        else {
          uVar10 = 0;
          fVar21 = 1e+18;
          uVar13 = 0;
          pfVar17 = local_70;
          do {
            lVar7 = (long)local_38;
            fVar19 = positions[lVar7].x - pfVar17[-2];
            fVar20 = positions[lVar7].y - pfVar17[-1];
            fVar18 = positions[lVar7].z - *pfVar17;
            fVar18 = fVar18 * fVar18 + fVar19 * fVar19 + fVar20 * fVar20;
            if (fVar18 < 0.0) {
              local_48 = CONCAT44(local_48._4_4_,fVar21);
              *(undefined8 *)(__s + -8) = 0x15a951;
              fVar18 = sqrtf(fVar18);
              fVar21 = (float)local_48;
            }
            else {
              fVar18 = SQRT(fVar18);
            }
            if (fVar18 < fVar21) {
              lVar7 = (long)local_38;
              fVar18 = positions[lVar7].x - pfVar17[-2];
              fVar19 = positions[lVar7].y - pfVar17[-1];
              fVar21 = positions[lVar7].z - *pfVar17;
              fVar21 = fVar21 * fVar21 + fVar18 * fVar18 + fVar19 * fVar19;
              if (fVar21 < 0.0) {
                *(undefined8 *)(__s + -8) = 0x15a9b3;
                fVar21 = sqrtf(fVar21);
              }
              else {
                fVar21 = SQRT(fVar21);
              }
              uVar13 = uVar10 & 0xffffffff;
            }
            uVar10 = uVar10 + 1;
            pfVar17 = pfVar17 + 3;
          } while (uVar11 != uVar10);
          lVar16 = (long)(int)uVar13;
          lVar7 = local_50;
          puVar14 = local_78;
          uVar15 = local_3c;
        }
        this = (vector<int,std::allocator<int>> *)(puVar14 + lVar16 * 0x18);
        __position._M_current = *(int **)(this + 8);
        if (__position._M_current == *(int **)(this + 0x10)) {
          *(undefined8 *)(__s + -8) = 0x15aa06;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          *(int **)(this + 8) = __position._M_current + 1;
        }
        local_38 = local_38 + 1;
      } while (local_38 < (int)uVar15);
    }
    if (0 < (int)local_34) {
      uVar10 = 0;
      do {
        piVar9 = *(int **)(puVar14 + uVar10 * 0x18);
        piVar1 = *(int **)(puVar14 + uVar10 * 0x18 + 8);
        if (piVar9 == piVar1) {
          fVar18 = 0.0;
          fVar19 = 0.0;
          fVar21 = 0.0;
        }
        else {
          fVar21 = 0.0;
          fVar19 = 0.0;
          fVar18 = 0.0;
          piVar12 = piVar9;
          do {
            iVar6 = *piVar12;
            fVar18 = fVar18 + positions[iVar6].x;
            fVar19 = fVar19 + positions[iVar6].y;
            fVar21 = fVar21 + positions[iVar6].z;
            piVar12 = piVar12 + 1;
          } while (piVar12 != piVar1);
        }
        fVar20 = (float)(ulong)((long)piVar1 - (long)piVar9 >> 2);
        *(ulong *)(local_60 + uVar10 * 0xc) = CONCAT44(fVar19 / fVar20,fVar18 / fVar20);
        *(float *)(local_60 + uVar10 * 0xc + 8) = fVar21 / fVar20;
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar11);
    }
    uVar3 = local_278._0_4_;
    local_278._0_4_ = local_278._0_4_ + 1;
  } while ((int)uVar3 < 9);
  if (0 < (int)local_34) {
    uVar10 = 0;
    do {
      piVar1 = *(int **)(puVar14 + uVar10 * 0x18 + 8);
      for (piVar9 = *(int **)(puVar14 + uVar10 * 0x18); piVar9 != piVar1; piVar9 = piVar9 + 1) {
        local_58[*piVar9] = (int)uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar11);
  }
  local_278 = (undefined1  [8])local_268;
  *(undefined8 *)(__s + -8) = 0x15ab32;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"receiver cluster","");
  *(undefined8 *)(__s + -8) = 0x15ab45;
  github111116::ConsoleLogger::timeEnd(&console,(string *)local_278);
  auVar4 = local_278;
  if (local_278 != (undefined1  [8])local_268) {
    *(undefined8 *)(__s + -8) = 0x15ab56;
    operator_delete((void *)auVar4);
  }
  *(undefined8 *)(__s + -8) = 0x15ab69;
  github111116::ConsoleLogger::log<char[27]>(&console,(char (*) [27])"cluster caching to disk...");
  *(undefined8 *)(__s + -8) = 0x15ab81;
  std::ofstream::ofstream(local_278,"cluster.cache",_S_out);
  *(undefined8 *)(__s + -8) = 0x15ab90;
  poVar8 = (ostream *)std::ostream::operator<<(local_278,uVar15);
  *(undefined8 *)(__s + -8) = 0x15aba4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  uVar5 = local_34;
  *(undefined8 *)(__s + -8) = 0x15abb3;
  poVar8 = (ostream *)std::ostream::operator<<(local_278,uVar5);
  *(undefined8 *)(__s + -8) = 0x15abc7;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  local_48 = (ulong)uVar15;
  if (0 < (int)uVar15) {
    lVar7 = local_48 * 0xc;
    lVar16 = 0;
    do {
      fVar21 = *(float *)((long)&positions->x + lVar16);
      *(undefined8 *)(__s + -8) = 0x15abff;
      poVar8 = std::ostream::_M_insert<double>((double)fVar21);
      *(undefined8 *)(__s + -8) = 0x15ac16;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      fVar21 = *(float *)((long)&positions->y + lVar16);
      *(undefined8 *)(__s + -8) = 0x15ac28;
      poVar8 = std::ostream::_M_insert<double>((double)fVar21);
      *(undefined8 *)(__s + -8) = 0x15ac3f;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      fVar21 = *(float *)((long)&positions->z + lVar16);
      *(undefined8 *)(__s + -8) = 0x15ac51;
      poVar8 = std::ostream::_M_insert<double>((double)fVar21);
      *(undefined8 *)(__s + -8) = 0x15ac65;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      lVar16 = lVar16 + 0xc;
    } while (lVar7 != lVar16);
  }
  piVar9 = local_58;
  if (0 < (int)local_3c) {
    uVar11 = 0;
    do {
      iVar6 = piVar9[uVar11];
      *(undefined8 *)(__s + -8) = 0x15ac99;
      poVar8 = (ostream *)std::ostream::operator<<(local_278,iVar6);
      *(undefined8 *)(__s + -8) = 0x15aca9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      uVar11 = uVar11 + 1;
    } while (local_48 != uVar11);
  }
  local_278 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_278 + *(long *)(_VTT + -0x18)) = _pthread_mutex_unlock;
  *(undefined8 *)(__s + -8) = 0x15acdc;
  std::filebuf::~filebuf((filebuf *)&fout);
  *(undefined8 *)(__s + -8) = 0x15ace8;
  std::ios_base::~ios_base(local_180);
  if (local_34 != 0) {
    lVar7 = local_68 * 3;
    do {
      pvVar2 = *(void **)(puVar14 + lVar7 + -0x18);
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)(__s + -8) = 0x15ad05;
        operator_delete(pvVar2);
      }
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void cluster_points_recalculate(int n, int n_cluster, const vec3f* positions, int* clusterids)
{
	console.time("receiver cluster");
	// random initialize clusters
	vec3f center[n_cluster];
	for (int i=0; i<n_cluster; ++i)
		center[i] = positions[rand()%n]; // a few may coincide, doesn't matter

	std::vector<int> assigned[n_cluster];
	for (int k=0; k<10; ++k) {
		console.log("receiver cluster iteration",k);
		for (int i=0; i<n_cluster; ++i)
			assigned[i].clear();
		// assign points to nearest cluster
		for (int i=0; i<n; ++i) {
			float bestnorm = 1e18;
			int best = 0;
			for (int j=0; j<n_cluster; ++j)
				if (bestnorm > norm(positions[i] - center[j])) {
					bestnorm = norm(positions[i] - center[j]);
					best = j;
				}
			assigned[best].push_back(i);
		}
		// move cluster center to average of points
		for (int i=0; i<n_cluster; ++i) {
			vec3f sum = 0;
			for (int x: assigned[i])
				sum += positions[x];
			center[i] = sum / assigned[i].size();
		}
	}
	for (int i=0; i<n_cluster; ++i)
		for (int x: assigned[i])
			clusterids[x] = i;
	console.timeEnd("receiver cluster");
	console.log("cluster caching to disk...");
	std::ofstream fout(cluster_file);
	fout << n << "\n";
	fout << n_cluster << "\n";
	for (int i=0; i<n; ++i)
		fout << positions[i].x << " " << positions[i].y << " " << positions[i].z << "\n";
	for (int i=0; i<n; ++i)
		fout << clusterids[i] << "\n";
}